

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O2

value_type __thiscall
FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>
::dx(FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>
     *this,int i)

{
  double dVar1;
  double dVar2;
  FadBinaryAdd<Fad<double>,_Fad<double>_> *this_00;
  value_type vVar3;
  value_type vVar4;
  double dVar5;
  
  vVar3 = FadBinaryMul<FadCst<double>,_Fad<double>_>::dx(&this->left_->fadexpr_,i);
  this_00 = &this->right_->fadexpr_;
  dVar1 = this_00->left_->val_;
  dVar2 = this_00->right_->val_;
  vVar4 = FadBinaryAdd<Fad<double>,_Fad<double>_>::dx(this_00,i);
  dVar5 = ((this->right_->fadexpr_).left_)->val_ + ((this->right_->fadexpr_).right_)->val_;
  return ((dVar1 + dVar2) * vVar3 -
         (this->left_->fadexpr_).left_.constant_ * ((this->left_->fadexpr_).right_)->val_ * vVar4) /
         (dVar5 * dVar5);
}

Assistant:

const value_type dx(int i) const {return  (left_.dx(i) * right_.val() - right_.dx(i) * left_.val() ) / (right_.val() * right_.val()) ;}